

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dragons-recognizer.cpp
# Opt level: O0

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::DragonsRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,DragonsRecognizer *this)

{
  initializer_list<mahjong::Pattern> __l;
  initializer_list<mahjong::Pattern> __l_00;
  allocator<mahjong::Pattern> local_56;
  less<mahjong::Pattern> local_55;
  Pattern local_54;
  iterator local_50;
  size_type local_48;
  allocator<mahjong::Pattern> local_2e;
  less<mahjong::Pattern> local_2d;
  Pattern local_2c;
  iterator local_28;
  size_type local_20;
  DragonsRecognizer *local_18;
  DragonsRecognizer *this_local;
  
  local_18 = this;
  this_local = (DragonsRecognizer *)__return_storage_ptr__;
  if (((this->is_dragon_pair & 1U) == 0) || (this->dragon_count != 2)) {
    if (this->dragon_count == 3) {
      local_54 = BigThreeDragons;
      local_50 = &local_54;
      local_48 = 1;
      std::allocator<mahjong::Pattern>::allocator(&local_56);
      __l._M_len = local_48;
      __l._M_array = local_50;
      std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
      set(__return_storage_ptr__,__l,&local_55,&local_56);
      std::allocator<mahjong::Pattern>::~allocator(&local_56);
    }
    else {
      memset(__return_storage_ptr__,0,0x30);
      std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
      set(__return_storage_ptr__);
    }
  }
  else {
    local_2c = LittleThreeDragons;
    local_28 = &local_2c;
    local_20 = 1;
    std::allocator<mahjong::Pattern>::allocator(&local_2e);
    __l_00._M_len = local_20;
    __l_00._M_array = local_28;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
              (__return_storage_ptr__,__l_00,&local_2d,&local_2e);
    std::allocator<mahjong::Pattern>::~allocator(&local_2e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<Pattern> DragonsRecognizer::recognize()
{
	if (is_dragon_pair && dragon_count == 2)
	{
		return { Pattern::LittleThreeDragons };
	}

	if (dragon_count == 3)
	{
		return { Pattern::BigThreeDragons };
	}

	return {};
}